

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O3

void work_gga_exc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined8 uVar29;
  undefined1 auVar28 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double local_148;
  double local_128;
  
  if (np != 0) {
    sVar6 = 0;
    do {
      lVar5 = (long)(p->dim).rho * sVar6;
      dVar8 = rho[lVar5];
      if (p->nspin == 2) {
        dVar8 = dVar8 + rho[lVar5 + 1];
      }
      dVar16 = p->dens_threshold;
      if (dVar16 <= dVar8) {
        dVar8 = rho[lVar5];
        if (rho[lVar5] <= dVar16) {
          dVar8 = dVar16;
        }
        dVar21 = p->sigma_threshold;
        dVar1 = sigma[(long)(p->dim).sigma * sVar6];
        pdVar2 = (double *)p->params;
        dVar31 = p->zeta_threshold;
        dVar9 = cbrt(0.3183098861837907);
        dVar10 = dVar9 * 1.4422495703074083 * 2.519842099789747;
        dVar11 = cbrt(dVar31);
        dVar20 = dVar31 * dVar11;
        local_148 = dVar20;
        if (dVar31 < 2.0) {
          local_148 = 2.5198420997897464;
        }
        dVar12 = cbrt(dVar8);
        dVar13 = cbrt(9.0);
        dVar25 = 1.0 / dVar12;
        dVar13 = (dVar13 * dVar13 * dVar9 * dVar9 * p->cam_omega * 1.4422495703074083 * dVar25 *
                 (double)(~-(ulong)(2.0 <= dVar31) & 0x3ff0000000000000 |
                         (ulong)(1.2599210498948732 / dVar11) & -(ulong)(2.0 <= dVar31))) / 18.0;
        dVar30 = 1.35;
        if (dVar13 <= 1.35) {
          dVar30 = dVar13;
        }
        dVar14 = erf((1.0 / dVar30) * 0.5);
        dVar15 = exp((-1.0 / (dVar30 * dVar30)) * 0.25);
        if (1.35 <= dVar13) {
          if (dVar13 <= 1.35) {
            dVar13 = 1.35;
          }
          dVar13 = dVar13 * dVar13;
          dVar30 = dVar13 * dVar13;
          dVar14 = dVar30 * dVar30;
          auVar24._8_8_ = dVar30;
          auVar24._0_8_ = dVar13;
          auVar32 = divpd(_DAT_00f54940,auVar24);
          auVar33 = divpd(auVar32,_DAT_00f60be0);
          auVar27._8_8_ = dVar14;
          auVar27._0_8_ = dVar13 * dVar30;
          auVar27 = divpd(_DAT_00f54940,auVar27);
          uVar29 = auVar27._8_8_;
          auVar19._8_8_ = 0x3ff0000000000000;
          auVar19._0_8_ = uVar29;
          auVar32._8_8_ = dVar14 * dVar14;
          auVar32._0_8_ = dVar13 * dVar30;
          auVar32 = divpd(auVar19,auVar32);
          auVar23._8_8_ = uVar29;
          auVar23._0_8_ = uVar29;
          auVar28._8_8_ = dVar30;
          auVar28._0_8_ = dVar13;
          auVar24 = divpd(auVar23,auVar28);
          auVar28 = divpd(auVar27,_DAT_00f60bf0);
          auVar24 = divpd(auVar24,_DAT_00f60c00);
          auVar32 = divpd(auVar32,_DAT_00f60c10);
          local_128 = ((((((auVar33._0_8_ - auVar33._8_8_) + auVar28._0_8_) - auVar28._8_8_) +
                        auVar24._0_8_) - auVar24._8_8_) + auVar32._0_8_) - auVar32._8_8_;
        }
        else {
          local_128 = dVar30 * -2.6666666666666665 *
                      (dVar14 * 1.7724538509055159 +
                      (dVar15 + -1.5 + (dVar15 + -1.0) * dVar30 * dVar30 * -2.0) * (dVar30 + dVar30)
                      ) + 1.0;
        }
        bVar4 = dVar16 < dVar8 * 0.5;
        dVar21 = dVar21 * dVar21;
        if (dVar1 <= dVar21) {
          dVar1 = dVar21;
        }
        dVar16 = dVar8 * dVar8;
        dVar13 = 1.0 / (dVar12 * dVar12);
        dVar14 = dVar1 * 1.5874010519681996 * (dVar13 / dVar16);
        dVar30 = (dVar13 / dVar16) * 1.5874010519681996;
        dVar15 = dVar1 * dVar1;
        dVar21 = dVar16 * dVar16;
        dVar38 = (dVar25 / (dVar8 * dVar21)) * 1.2599210498948732;
        dVar35 = dVar1 * dVar15;
        dVar37 = 1.0 / (dVar21 * dVar21);
        dVar36 = dVar15 * dVar15;
        dVar16 = (dVar13 / (dVar21 * dVar21 * dVar16)) * 1.5874010519681996;
        dVar8 = 0.0;
        if (bVar4 && dVar31 < 1.0) {
          dVar8 = dVar14 * 0.004 + 1.0;
          dVar21 = dVar8 * dVar8;
          dVar8 = dVar10 * 1.2599210498948732 * -0.046875 * dVar12 * local_148 *
                  local_128 *
                  ((1.0 / dVar8) * pdVar2[1] * dVar1 * 0.004 * dVar30 + *pdVar2 +
                   (1.0 / dVar21) * dVar38 * pdVar2[2] * dVar15 * 3.2e-05 +
                   (1.0 / (dVar8 * dVar21)) * dVar37 * pdVar2[3] * dVar35 * 2.56e-07 +
                  (1.0 / (dVar21 * dVar21)) * dVar16 * pdVar2[4] * dVar36 * 1.024e-09);
          dVar8 = dVar8 + dVar8;
        }
        dVar21 = 1.0;
        if (1.0 <= dVar31) {
          dVar21 = p->zeta_threshold;
        }
        uVar7 = -(ulong)(1.0 <= dVar31);
        dVar11 = (double)((ulong)(1.0 / dVar11) & uVar7 | ~uVar7 & 0x3ff0000000000000);
        dVar10 = dVar10 * dVar25;
        dVar34 = dVar10 * 1.2599210498948732 * dVar11;
        dVar25 = SQRT(dVar34);
        dVar12 = dVar25;
        if (dVar34 < 0.0) {
          dVar12 = sqrt(dVar34);
          dVar25 = sqrt(dVar34);
        }
        dVar25 = dVar25 * dVar34;
        dVar13 = dVar9 * dVar9 * 2.080083823051904 * 1.5874010519681996 * dVar13;
        dVar22 = dVar13 * 1.5874010519681996 * dVar11 * dVar11;
        dVar11 = log(16.081824322151103 /
                     (dVar22 * 0.123235 + dVar25 * 0.204775 + dVar12 * 3.79785 + dVar34 * 0.8969) +
                     1.0);
        dVar9 = p->zeta_threshold;
        dVar17 = log(32.1646831778707 /
                     (dVar22 * 0.1562925 + dVar25 * 0.420775 + dVar12 * 7.05945 + dVar34 * 1.549425)
                     + 1.0);
        dVar12 = log(29.608574643216677 /
                     (dVar22 * 0.1241775 + dVar25 * 0.1100325 + dVar12 * 5.1785 + dVar34 * 0.905775)
                     + 1.0);
        dVar25 = 0.0;
        if (bVar4 && dVar31 < 1.0) {
          dVar12 = (dVar34 * 0.0278125 + 1.0) * dVar12;
          dVar11 = (dVar34 * 0.053425 + 1.0) * 0.062182 * dVar11;
          dVar31 = (local_148 + (double)(-(ulong)(0.0 <= dVar9) & (ulong)dVar20) + -2.0) *
                   1.9236610509315362;
          dVar25 = dVar21 * (dVar31 * 0.019751789702565206 * dVar12 +
                            ((dVar12 * -0.019751789702565206 +
                             (dVar34 * 0.05137 + 1.0) * -0.03109 * dVar17 + dVar11) * dVar31 -
                            dVar11)) * 0.5;
        }
        dVar21 = pdVar2[6];
        dVar22 = dVar14 * 0.2 + 1.0;
        dVar31 = pdVar2[7];
        dVar9 = pdVar2[8];
        dVar11 = pdVar2[9];
        dVar12 = pdVar2[5];
        dVar17 = SQRT(dVar10);
        dVar34 = dVar17;
        if (dVar10 < 0.0) {
          dVar34 = sqrt(dVar10);
        }
        if (dVar10 < 0.0) {
          dVar17 = sqrt(dVar10);
        }
        dVar18 = log(16.081824322151103 /
                     (dVar13 * 0.123235 +
                     dVar17 * dVar10 * 0.204775 + dVar34 * 3.79785 + dVar10 * 0.8969) + 1.0);
        dVar26 = (double)(~uVar7 & 0x3ff0000000000000 | uVar7 & (ulong)dVar20);
        dVar20 = log(29.608574643216677 /
                     (dVar13 * 0.1241775 +
                     dVar17 * dVar10 * 0.1100325 + dVar34 * 5.1785 + dVar10 * 0.905775) + 1.0);
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          dVar34 = dVar22 * dVar22;
          dVar14 = dVar14 * 0.006 + 1.0;
          dVar13 = dVar14 * dVar14;
          lVar5 = (long)(p->dim).zk * sVar6;
          pdVar3[lVar5] =
               (dVar30 * dVar1 * pdVar2[0xb] * 0.006 * (1.0 / dVar14) + pdVar2[10] +
                dVar15 * pdVar2[0xc] * 7.2e-05 * (1.0 / dVar13) * dVar38 +
                dVar35 * pdVar2[0xd] * 8.64e-07 * (1.0 / (dVar14 * dVar13)) * dVar37 +
               dVar36 * pdVar2[0xe] * 5.184e-09 * (1.0 / (dVar13 * dVar13)) * dVar16) *
               (((dVar10 * 0.053425 + 1.0) * -0.062182 * dVar18 +
                (dVar10 * 0.0278125 + 1.0) *
                (dVar26 + dVar26 + -2.0) * 1.9236610509315362 * 0.019751789702565206 * dVar20) -
               (dVar25 + dVar25)) +
               dVar8 + (dVar11 * dVar36 * 0.0064 * (1.0 / (dVar34 * dVar34)) * dVar16 +
                       dVar9 * dVar35 * 0.032 * (1.0 / (dVar22 * dVar34)) * dVar37 +
                       dVar31 * dVar15 * 0.08 * (1.0 / dVar34) * dVar38 +
                       dVar21 * dVar1 * 0.2 * dVar30 * (1.0 / dVar22) + dVar12) * (dVar25 + dVar25)
               + pdVar3[lVar5];
        }
      }
      sVar6 = sVar6 + 1;
    } while (np != sVar6);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}